

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contacts.cpp
# Opt level: O1

void __thiscall CFriends::Init(CFriends *this)

{
  Init((CFriends *)&this[-1].super_IContactList.m_aContacts[0x7f].m_NameHash);
  return;
}

Assistant:

void CFriends::Init()
{
	IConfigManager *pConfigManager = Kernel()->RequestInterface<IConfigManager>();
	if(pConfigManager)
		pConfigManager->RegisterCallback(ConfigSaveCallback, this);

	IConsole *pConsole = Kernel()->RequestInterface<IConsole>();
	if(pConsole)
	{
		pConsole->Register("add_friend", "s[name] s[clan]", CFGFLAG_CLIENT, ConAddFriend, this, "Add a friend");
		pConsole->Register("remove_friend", "s[name] s[clan]", CFGFLAG_CLIENT, ConRemoveFriend, this, "Remove a friend");
	}
}